

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.h
# Opt level: O1

shared_ptr<gmlc::networking::Socket> __thiscall
gmlc::networking::SocketFactory::create_socket(SocketFactory *this,io_context *io_context)

{
  runtime_error *this_00;
  io_context *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gmlc::networking::Socket> sVar1;
  undefined1 local_29;
  AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (*(char *)&io_context[1].super_execution_context.service_registry_ == '\0') {
    local_28 = (AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>,std::allocator<gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>,asio::io_context&>
              (&_Stack_20,&local_28,
               (allocator<gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
                *)&local_29,in_RDX);
    (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_28;
    (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
    super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_20._M_pi;
    sVar1.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<gmlc::networking::Socket>)
           sVar1.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"gmlc::networking library not compiled with encryption support");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Socket> create_socket(asio::io_context& io_context) const
    {
        if (!encrypted) {
            return std::make_shared<AsioSocket<asio::ip::tcp::socket>>(
                io_context);
        } else {
#ifdef GMLC_NETWORKING_ENABLE_ENCRYPTION
            // SSL_CTX in OpenSSL is reference counted; asio::ssl::context is a
            // wrapper around a SSL_CTX* SSL_CTX should not be changed after
            // using it to create any SSL objects more details at:
            // https://www.openssl.org/docs/manmaster/man3/SSL_CTX_new.html
            asio::ssl::context ssl_context(asio::ssl::context::tls);

            if (!password.empty()) {
                ssl_context.set_password_callback(
                    [pw = this->password](auto /*max_len*/, auto /*purpose*/) {
                        return pw;
                    });
            }
            if (use_default_verify_paths) {
                ssl_context.set_default_verify_paths();
            }
            if (!verify_file.empty()) {
                ssl_context.load_verify_file(verify_file);
            }
            if (!verify_path.empty()) {
                ssl_context.add_verify_path(verify_path);
            }
            if (!certificate_chain_file.empty()) {
                ssl_context.use_certificate_chain_file(certificate_chain_file);
            }
            if (!certificate_file.empty()) {
                ssl_context.use_certificate_file(
                    certificate_file, asio::ssl::context::pem);
            }
            if (!private_key_file.empty()) {
                ssl_context.use_private_key_file(
                    private_key_file, asio::ssl::context::pem);
            }
            if (!rsa_private_key_file.empty()) {
                ssl_context.use_rsa_private_key_file(
                    rsa_private_key_file, asio::ssl::context::pem);
            }
            if (!tmp_dh_file.empty()) {
                ssl_context.use_tmp_dh_file(tmp_dh_file);
            }

            return std::make_shared<
                AsioSocket<asio::ssl::stream<asio::ip::tcp::socket>>>(
                io_context, ssl_context);
#else
            throw std::runtime_error(
                "gmlc::networking library not compiled with encryption support");
#endif
        }
    }